

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

void __thiscall
duckdb::DBConfig::SetOption
          (DBConfig *this,DatabaseInstance *db,ConfigurationOption *option,Value *value)

{
  int iVar1;
  InvalidInputException *this_00;
  Value input;
  allocator local_a1;
  LogicalType local_a0;
  string local_88;
  Value local_68;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  if (option->set_global != (set_global_function_t)0x0) {
    ::std::__cxx11::string::string((string *)&local_88,option->parameter_type,&local_a1);
    ParseLogicalType(&local_a0,&local_88);
    Value::DefaultCastAs(&local_68,value,&local_a0,false);
    LogicalType::~LogicalType(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    (*option->set_global)(db,this,&local_68);
    Value::~Value(&local_68);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_68.type_._0_8_ = (long)&local_68 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Could not set option \"%s\" as a global option","");
  InvalidInputException::InvalidInputException<char_const*>
            (this_00,(string *)&local_68,option->name);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DBConfig::SetOption(DatabaseInstance *db, const ConfigurationOption &option, const Value &value) {
	lock_guard<mutex> l(config_lock);
	if (!option.set_global) {
		throw InvalidInputException("Could not set option \"%s\" as a global option", option.name);
	}
	D_ASSERT(option.reset_global);
	Value input = value.DefaultCastAs(ParseLogicalType(option.parameter_type));
	option.set_global(db, *this, input);
}